

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheGL::DbgVerifyDynamicBufferMasks(ShaderResourceCacheGL *this)

{
  BufferGLImpl *pBVar1;
  ulong uVar2;
  bool bVar3;
  CachedUB *pCVar4;
  CachedSSBO *this_00;
  byte bVar5;
  char (*in_R8) [33];
  ulong uVar6;
  string msg;
  Uint32 local_54;
  string local_50;
  
  local_54 = 0;
  if (0x17 < this->m_TexturesOffset) {
    do {
      pCVar4 = GetConstUB(this,local_54);
      pBVar1 = (pCVar4->pBuffer).m_pObject;
      in_R8 = (char (*) [33])0x0;
      if (pBVar1 != (BufferGLImpl *)0x0) {
        in_R8 = (char (*) [33])
                (ulong)((this->m_DynamicUBOSlotMask & 1L << ((byte)local_54 & 0x3f)) != 0 &&
                       (ulong)pCVar4->RangeSize <
                       (pBVar1->super_BufferBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                       .m_Desc.Size);
      }
      if ((uint)in_R8 != (uint)((this->m_DynamicUBOMask >> ((ulong)local_54 & 0x3f) & 1) != 0)) {
        FormatString<char[5],unsigned_int,char[32]>
                  (&local_50,(Diligent *)"Bit ",(char (*) [5])&local_54,
                   (uint *)" in m_DynamicUBOMask is invalid",(char (*) [32])in_R8);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"DbgVerifyDynamicBufferMasks",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                   ,0x15a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      local_54 = local_54 + 1;
    } while (local_54 < this->m_TexturesOffset / 0x18);
  }
  local_54 = 0;
  if ((int)((ulong)this->m_MemoryEndOffset - (ulong)this->m_SSBOsOffset >> 4) != 0) {
    do {
      this_00 = GetConstSSBO(this,local_54);
      uVar6 = (ulong)local_54;
      bVar5 = (byte)local_54;
      uVar2 = this->m_DynamicSSBOMask;
      bVar3 = CachedSSBO::IsDynamic(this_00);
      if (((uVar2 >> (uVar6 & 0x3f) & 1) == 0) ==
          ((1L << (bVar5 & 0x3f) & this->m_DynamicSSBOSlotMask) != 0 && bVar3)) {
        FormatString<char[5],unsigned_int,char[33]>
                  (&local_50,(Diligent *)"Bit ",(char (*) [5])&local_54,
                   (uint *)" in m_DynamicSSBOMask is invalid",in_R8);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"DbgVerifyDynamicBufferMasks",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderResourceCacheGL.cpp"
                   ,0x161);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      local_54 = local_54 + 1;
    } while (local_54 < (uint)((ulong)this->m_MemoryEndOffset - (ulong)this->m_SSBOsOffset >> 4));
  }
  return;
}

Assistant:

void ShaderResourceCacheGL::DbgVerifyDynamicBufferMasks() const
{
    for (Uint32 ub = 0; ub < GetUBCount(); ++ub)
    {
        const auto& UB    = GetConstUB(ub);
        const auto  UBBit = Uint64{1} << Uint64{ub};
        VERIFY(((m_DynamicUBOMask & UBBit) != 0) == (UB.IsDynamic() && (m_DynamicUBOSlotMask & UBBit) != 0), "Bit ", ub, " in m_DynamicUBOMask is invalid");
    }

    for (Uint32 ssbo = 0; ssbo < GetSSBOCount(); ++ssbo)
    {
        const auto& SSBO    = GetConstSSBO(ssbo);
        const auto  SSBOBit = Uint64{1} << Uint64{ssbo};
        VERIFY(((m_DynamicSSBOMask & SSBOBit) != 0) == (SSBO.IsDynamic() && (m_DynamicSSBOSlotMask & SSBOBit) != 0), "Bit ", ssbo, " in m_DynamicSSBOMask is invalid");
    }
}